

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *
duckdb::Exception::ConstructMessageRecursive<unsigned_long,unsigned_long>
          (string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,unsigned_long param,unsigned_long params)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *in_RDI;
  string *in_R8;
  value_type *in_stack_ffffffffffffff68;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *this;
  unsigned_long in_stack_ffffffffffffffc8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffff68);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back(this,in_stack_ffffffffffffff68);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x15f0a2);
  ConstructMessageRecursive<unsigned_long>
            (in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}